

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.h
# Opt level: O0

int32_t __thiscall cornelich::region::position(region *this)

{
  region *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->m_position_offset).super___atomic_base<int>._M_i - this->m_start_offset;
}

Assistant:

std::int32_t position() const { return m_position_offset.load(std::memory_order_relaxed) - m_start_offset; }